

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMeasurementsTest.cpp
# Opt level: O2

int TestMeasurementsTest(int argc,char **argv)

{
  EStatusCode EVar1;
  EncryptionOptions *pEVar2;
  PDFPage *this;
  PageContentContext *inPageContext;
  PDFUsedFont *this_00;
  int iVar3;
  char *pcVar4;
  allocator<char> local_1042;
  allocator<char> local_1041;
  DoubleAndDoublePairList pathPoints;
  TextOptions textOptions;
  string local_ff8;
  GraphicOptions pathStrokeOptions;
  TextMeasures textDimensions;
  string local_f48;
  EncryptionOptions local_f28;
  PDFWriter pdfWriter;
  
  PDFWriter::PDFWriter(&pdfWriter);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pathPoints,"TextMeasurementsTest.pdf",&local_1041);
  BuildRelativeOutputPath((string *)&textOptions,argv,(string *)&pathPoints);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f48,"TextMeasurementsTest.log",&local_1042);
  BuildRelativeOutputPath(&local_ff8,argv,&local_f48);
  iVar3 = 1;
  LogConfiguration::LogConfiguration((LogConfiguration *)&pathStrokeOptions,true,true,&local_ff8);
  pEVar2 = EncryptionOptions::DefaultEncryptionOptions();
  EncryptionOptions::EncryptionOptions(&local_f28,pEVar2);
  EncryptionOptions::EncryptionOptions((EncryptionOptions *)&textDimensions.yMin,&local_f28);
  textDimensions.xMin._0_2_ = 0x101;
  EVar1 = PDFWriter::StartPDF(&pdfWriter,(string *)&textOptions,ePDFVersion13,
                              (LogConfiguration *)&pathStrokeOptions,
                              (PDFCreationSettings *)&textDimensions);
  EncryptionOptions::~EncryptionOptions((EncryptionOptions *)&textDimensions.yMin);
  EncryptionOptions::~EncryptionOptions(&local_f28);
  std::__cxx11::string::~string((string *)&pathStrokeOptions.colorValue);
  std::__cxx11::string::~string((string *)&local_ff8);
  std::__cxx11::string::~string((string *)&local_f48);
  std::__cxx11::string::~string((string *)&textOptions);
  std::__cxx11::string::~string((string *)&pathPoints);
  if (EVar1 != eSuccess) {
    std::operator<<((ostream *)&std::cout,"Failed to start file\n");
    goto LAB_0014511d;
  }
  this = (PDFPage *)operator_new(0x2b8);
  PDFPage::PDFPage(this);
  PDFRectangle::PDFRectangle((PDFRectangle *)&textDimensions,0.0,0.0,595.0,842.0);
  PDFPage::SetMediaBox(this,(PDFRectangle *)&textDimensions);
  PDFRectangle::~PDFRectangle((PDFRectangle *)&textDimensions);
  inPageContext = PDFWriter::StartPageContentContext(&pdfWriter,this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pathPoints,"fonts/arial.ttf",(allocator<char> *)&local_f48);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pathStrokeOptions,argv[1],(allocator<char> *)&local_ff8);
  LocalPathToFileURL((FileURL *)&textDimensions,(string *)&pathStrokeOptions);
  RelativeURLToLocalPath((string *)&textOptions,(FileURL *)&textDimensions,(string *)&pathPoints);
  FileURL::~FileURL((FileURL *)&textDimensions);
  std::__cxx11::string::~string((string *)&pathStrokeOptions);
  this_00 = PDFWriter::GetFontForFile(&pdfWriter,(string *)&textOptions,0);
  std::__cxx11::string::~string((string *)&textOptions);
  std::__cxx11::string::~string((string *)&pathPoints);
  if (this_00 == (PDFUsedFont *)0x0) {
    std::operator<<((ostream *)&std::cout,"Failed to create font for arial font\n");
    goto LAB_0014511d;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&textDimensions,"DarkMagenta",(allocator<char> *)&textOptions);
  pathStrokeOptions.colorValue =
       AbstractContentContext::ColorValueForName((string *)&textDimensions);
  pathStrokeOptions.drawingType = eStroke;
  pathStrokeOptions.colorSpace = eRGB;
  pathStrokeOptions.strokeWidth = 4.0;
  pathStrokeOptions.close = false;
  pathStrokeOptions.opacity = 255.0;
  std::__cxx11::string::~string((string *)&textDimensions);
  textOptions.fontSize = 14.0;
  textOptions.colorSpace = eGray;
  textOptions.colorValue = 0;
  textOptions.opacity = 255.0;
  textOptions.font = this_00;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pathPoints,"Hello World",(allocator<char> *)&local_ff8);
  PDFUsedFont::CalculateTextDimensions(&textDimensions,this_00,(string *)&pathPoints,0xe);
  std::__cxx11::string::~string((string *)&pathPoints);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&pathPoints,"Hello World",(allocator<char> *)&local_ff8);
  AbstractContentContext::WriteText
            (&inPageContext->super_AbstractContentContext,10.0,100.0,(string *)&pathPoints,
             &textOptions);
  std::__cxx11::string::~string((string *)&pathPoints);
  pathPoints.
  super__List_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  _M_node._M_size = 0;
  local_ff8._M_dataplus._M_p =
       (pointer)((double)CONCAT62(textDimensions.xMin._2_6_,textDimensions.xMin._0_2_) + 10.0);
  local_ff8._M_string_length = (size_type)(textDimensions.yMin + 98.0);
  pathPoints.
  super__List_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&pathPoints;
  pathPoints.
  super__List_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&pathPoints;
  std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  push_back((list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
            &pathPoints,(value_type *)&local_ff8);
  local_ff8._M_dataplus._M_p = (pointer)(textDimensions.xMax + 10.0);
  local_ff8._M_string_length = (size_type)(textDimensions.yMin + 98.0);
  std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  push_back(&pathPoints,(value_type *)&local_ff8);
  AbstractContentContext::DrawPath
            (&inPageContext->super_AbstractContentContext,&pathPoints,&pathStrokeOptions);
  std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::clear
            (&pathPoints);
  local_ff8._M_dataplus._M_p =
       (pointer)((double)CONCAT62(textDimensions.xMin._2_6_,textDimensions.xMin._0_2_) + 10.0);
  local_ff8._M_string_length = (size_type)(textDimensions.yMax + 102.0);
  std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  push_back(&pathPoints,(value_type *)&local_ff8);
  local_ff8._M_dataplus._M_p = (pointer)(textDimensions.xMax + 10.0);
  local_ff8._M_string_length = (size_type)(textDimensions.yMax + 102.0);
  std::__cxx11::list<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  push_back(&pathPoints,(value_type *)&local_ff8);
  AbstractContentContext::DrawPath
            (&inPageContext->super_AbstractContentContext,&pathPoints,&pathStrokeOptions);
  EVar1 = PDFWriter::EndPageContentContext(&pdfWriter,inPageContext);
  if (EVar1 == eSuccess) {
    EVar1 = PDFWriter::WritePageAndRelease(&pdfWriter,this);
    if (EVar1 != eSuccess) {
      pcVar4 = "Failed to write page\n";
      goto LAB_00145104;
    }
    EVar1 = PDFWriter::EndPDF(&pdfWriter);
    if (EVar1 != eSuccess) {
      pcVar4 = "Failed to end pdf\n";
      goto LAB_00145104;
    }
    iVar3 = 0;
  }
  else {
    pcVar4 = "Failed to end content context\n";
LAB_00145104:
    std::operator<<((ostream *)&std::cout,pcVar4);
    iVar3 = 1;
  }
  std::__cxx11::_List_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
  _M_clear(&pathPoints.
            super__List_base<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
          );
LAB_0014511d:
  PDFWriter::~PDFWriter(&pdfWriter);
  return iVar3;
}

Assistant:

int TestMeasurementsTest(int argc, char* argv[])
{
	EStatusCode status = eSuccess;
	PDFWriter pdfWriter;

	do
	{
		status = pdfWriter.StartPDF(BuildRelativeOutputPath(argv,"TextMeasurementsTest.pdf"),
                                    ePDFVersion13,
                                    LogConfiguration(true,true,
                                                     BuildRelativeOutputPath(argv,"TextMeasurementsTest.log")));
		if(status != eSuccess)
		{
			cout<<"Failed to start file\n";
			break;
		}

		PDFPage* page = new PDFPage();
		page->SetMediaBox(PDFRectangle(0,0,595,842));
		
		PageContentContext* cxt = pdfWriter.StartPageContentContext(page);
		PDFUsedFont* arialFont = pdfWriter.GetFontForFile(
                                                     BuildRelativeInputPath(
                                                                            argv,
                                                                            "fonts/arial.ttf"));
		if(!arialFont)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to create font for arial font\n";
			break;
		}

		AbstractContentContext::GraphicOptions pathStrokeOptions(AbstractContentContext::eStroke,
																AbstractContentContext::eRGB,
																AbstractContentContext::ColorValueForName("DarkMagenta"),
																4);
		AbstractContentContext::TextOptions textOptions(arialFont,
														14,
														AbstractContentContext::eGray,
														0);

		PDFUsedFont::TextMeasures textDimensions = arialFont->CalculateTextDimensions("Hello World",14);

		cxt->WriteText(10,100,"Hello World",textOptions);
		DoubleAndDoublePairList pathPoints;
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMin,98+textDimensions.yMin));
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMax,98+textDimensions.yMin));
		cxt->DrawPath(pathPoints,pathStrokeOptions);
		pathPoints.clear();
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMin,102+textDimensions.yMax));
		pathPoints.push_back(DoubleAndDoublePair(10+textDimensions.xMax,102+textDimensions.yMax));
		cxt->DrawPath(pathPoints,pathStrokeOptions);

		status = pdfWriter.EndPageContentContext(cxt);
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to end content context\n";
			break;
		}

		status = pdfWriter.WritePageAndRelease(page);
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to write page\n";
			break;
		}


		status = pdfWriter.EndPDF();
		if(status != eSuccess)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to end pdf\n";
			break;
		}

	}while(false);


	return status == eSuccess ? 0:1;
}